

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

Var Js::JavascriptOperators::OP_GetElementI(Var instance,Var index,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  Var pvVar4;
  undefined4 *puVar5;
  double dVar6;
  RecyclableObject *local_38;
  RecyclableObject *cacheOwner;
  PropertyRecordUsageCache *propertyRecordUsageCache;
  
  pvVar4 = (Var)BreakSpeculation();
  if (((ulong)index & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)index & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)index & 0xffff000000000000) != 0x1000000000000) {
      if ((ulong)index >> 0x32 == 0) {
        bVar2 = VarIs<Js::RecyclableObject>(pvVar4);
        if ((bVar2) &&
           (bVar2 = GetPropertyRecordUsageCache
                              (index,scriptContext,(PropertyRecordUsageCache **)&cacheOwner,
                               &local_38), bVar2)) {
          pvVar4 = GetElementIWithCache<false>
                             (pvVar4,local_38,(PropertyRecordUsageCache *)cacheOwner,scriptContext,
                              (PropertyCacheOperationInfo *)0x0);
          return pvVar4;
        }
      }
      else {
        uVar3 = JavascriptConversion::ToUInt32_Full(index,scriptContext);
        if (-1 < (int)uVar3) {
          dVar6 = (double)uVar3;
          if (((double)((ulong)index ^ 0xfffc000000000000) == dVar6) &&
             (!NAN((double)((ulong)index ^ 0xfffc000000000000)) && !NAN(dVar6))) {
            index = (Var)((ulong)uVar3 | 0x1000000000000);
            goto LAB_00aad2e2;
          }
        }
      }
      pvVar4 = GetElementIHelper(pvVar4,index,pvVar4,scriptContext);
      return pvVar4;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
LAB_00aad2e2:
  pvVar4 = GetElementIIntIndex(pvVar4,index,scriptContext);
  return pvVar4;
}

Assistant:

Var JavascriptOperators::OP_GetElementI(Var instance, Var index, ScriptContext* scriptContext)
    {
#ifdef ENABLE_SPECTRE_RUNTIME_MITIGATIONS
        instance = BreakSpeculation(instance);
#endif
        if (TaggedInt::Is(index))
        {
            return GetElementIIntIndex(instance, index, scriptContext);
        }

        if (JavascriptNumber::Is_NoTaggedIntCheck(index))
        {
            uint32 uint32Index = JavascriptConversion::ToUInt32(index, scriptContext);

            if ((double)uint32Index == JavascriptNumber::GetValue(index) && !TaggedInt::IsOverflow(uint32Index))
            {
                index = TaggedInt::ToVarUnchecked(uint32Index);
                return GetElementIIntIndex(instance, index, scriptContext);
            }
        }
        else if (VarIs<RecyclableObject>(instance))
        {
            RecyclableObject* cacheOwner;
            PropertyRecordUsageCache* propertyRecordUsageCache;
            if (GetPropertyRecordUsageCache(index, scriptContext, &propertyRecordUsageCache, &cacheOwner))
            {
                return GetElementIWithCache<false /* ReturnOperationInfo */>(instance, cacheOwner, propertyRecordUsageCache, scriptContext, nullptr);
            }
        }

        return JavascriptOperators::GetElementIHelper(instance, index, instance, scriptContext);
    }